

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict_manager.cpp
# Opt level: O2

void __thiscall duckdb::ConflictManager::FinishLookup(ConflictManager *this)

{
  bool bVar1;
  
  if (((this->mode != THROW) && (bVar1 = SingleIndexTarget(this), bVar1)) &&
     ((this->conflicts).count != 0)) {
    this->single_index_finished = true;
  }
  return;
}

Assistant:

void ConflictManager::FinishLookup() {
	if (mode == ConflictManagerMode::THROW) {
		return;
	}
	if (!SingleIndexTarget()) {
		return;
	}
	if (conflicts.Count() != 0) {
		// We have recorded conflicts from the one index we're interested in
		// We set this so we don't duplicate the conflicts when there are duplicate indexes
		// that also match our conflict target
		single_index_finished = true;
	}
}